

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O1

bool QBmpHandler::canRead(QIODevice *device)

{
  long lVar1;
  long in_FS_OFFSET;
  bool bVar2;
  char head [2];
  short local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    canRead();
  }
  else {
    local_a = -0x5556;
    lVar1 = QIODevice::peek((char *)device,(longlong)&local_a);
    if (lVar1 == 2) {
      bVar2 = local_a == 0x4d42;
      goto LAB_0026caac;
    }
  }
  bVar2 = false;
LAB_0026caac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QBmpHandler::canRead(QIODevice *device)
{
    if (!device) {
        qWarning("QBmpHandler::canRead() called with 0 pointer");
        return false;
    }

    char head[2];
    if (device->peek(head, sizeof(head)) != sizeof(head))
        return false;

    return (qstrncmp(head, "BM", 2) == 0);
}